

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineNurbs::Derive(ChLineNurbs *this,ChVector<double> *dir,double parU)

{
  ChVector<double> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  ChVectorDynamic<> mdR;
  ChVectorDynamic<> mR;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  double local_30;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_28;
  
  local_30 = ComputeKnotUfromU(this,parU);
  local_28.m_storage.m_data = (double *)0x0;
  local_28.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_28,(long)this->p + 1);
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_48,(long)this->p + 1);
  ChBasisToolsNurbs::BasisEvaluateDeriv
            (this->p,local_30,&this->weights,&this->knots,(ChVectorDynamic<> *)&local_28,
             (ChVectorDynamic<> *)&local_48);
  iVar7 = ChBasisToolsBspline::FindSpan(this->p,local_30,&this->knots);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_00b689a0;
    dir->m_data[2] = DAT_00b689a8;
  }
  uVar5 = this->p;
  if ((int)uVar5 < 0) {
    if (local_48.m_storage.m_data == (double *)0x0) goto LAB_007ff9bd;
  }
  else {
    dVar10 = dir->m_data[0];
    dVar11 = dir->m_data[1];
    dVar2 = dir->m_data[2];
    pdVar8 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(iVar7 - uVar5)].m_data + 2;
    uVar9 = 0;
    do {
      if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar9) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar3 = local_48.m_storage.m_data[uVar9];
      uVar9 = uVar9 + 1;
      dVar4 = *pdVar8;
      pCVar1 = (ChVector<double> *)(pdVar8 + -2);
      pdVar6 = pdVar8 + -1;
      pdVar8 = pdVar8 + 3;
      dVar10 = dVar3 * pCVar1->m_data[0] + dVar10;
      dVar11 = dVar3 * *pdVar6 + dVar11;
      dVar2 = dVar3 * dVar4 + dVar2;
      dir->m_data[0] = dVar10;
      dir->m_data[1] = dVar11;
      dir->m_data[2] = dVar2;
    } while ((ulong)uVar5 + 1 != uVar9);
  }
  free((void *)local_48.m_storage.m_data[-1]);
LAB_007ff9bd:
  if (local_28.m_storage.m_data != (double *)0x0) {
    free((void *)local_28.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChLineNurbs::Derive(ChVector<>& dir, const double parU) const {
    double u = ComputeKnotUfromU(parU);

    ChVectorDynamic<> mR(this->p + 1);
    ChVectorDynamic<> mdR(this->p + 1);
    ChBasisToolsNurbs::BasisEvaluateDeriv(this->p, u, this->weights, this->knots, mR, mdR);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * mdR(i);
    }
}